

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

double __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GetDouble(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  bVar2 = IsNumber(this);
  if (!bVar2) {
    __assert_fail("IsNumber()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                  ,0x59a,
                  "double rapidjson::GenericValue<rapidjson::UTF8<>>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((this->flags_ & 0x4000) == 0) {
    if ((this->flags_ & 0x400) == 0) {
      if ((this->flags_ & 0x800) == 0) {
        if ((this->flags_ & 0x1000) == 0) {
          if ((this->flags_ & 0x2000) == 0) {
            __assert_fail("(flags_ & kUint64Flag) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                          ,0x59f,
                          "double rapidjson::GenericValue<rapidjson::UTF8<>>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          uVar1 = *(undefined8 *)&this->data_;
          auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar3._0_8_ = uVar1;
          auVar3._12_4_ = 0x45300000;
          this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)((auVar3._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        }
        else {
          this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(double)(long)(this->data_).s.str;
        }
      }
      else {
        this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)(double)*(uint *)&this->data_;
      }
    }
    else {
      this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)(double)*(int *)&this->data_;
    }
  }
  else {
    this_local = (this->data_).a.elements;
  }
  return (double)this_local;
}

Assistant:

double GetDouble() const {
        RAPIDJSON_ASSERT(IsNumber());
        if ((flags_ & kDoubleFlag) != 0)                return data_.n.d;   // exact type, no conversion.
        if ((flags_ & kIntFlag) != 0)                   return data_.n.i.i; // int -> double
        if ((flags_ & kUintFlag) != 0)                  return data_.n.u.u; // unsigned -> double
        if ((flags_ & kInt64Flag) != 0)                 return (double)data_.n.i64; // int64_t -> double (may lose precision)
        RAPIDJSON_ASSERT((flags_ & kUint64Flag) != 0);  return (double)data_.n.u64; // uint64_t -> double (may lose precision)
    }